

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLink.cpp
# Opt level: O1

void __thiscall chrono::ChLink::ArchiveOUT(ChLink *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLink>(marchive);
  ChLinkBase::ArchiveOUT(&this->super_ChLinkBase,marchive);
  local_38._value = &this->react_force;
  local_38._name = "react_force";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->react_torque;
  local_38._name = "react_torque";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChLink::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLink>();

    // serialize parent class
    ChLinkBase::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(react_force);
    marchive << CHNVP(react_torque);
}